

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_astLambdaNode_primitiveCompileIntoBytecode
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  sysbvm_tuple_t functionDefinition;
  long lVar2;
  sysbvm_tuple_t captures;
  ulong uVar3;
  sysbvm_tuple_t sVar4;
  sysbvm_tuple_t sVar5;
  long lVar6;
  sysbvm_tuple_t sVar7;
  bool bVar8;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  sVar5 = *(sysbvm_tuple_t *)(*arguments + 0x60);
  functionDefinition =
       sysbvm_functionBytecodeAssembler_addLiteral
                 (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),sVar5);
  lVar2 = *(long *)(sVar5 + 0x80);
  lVar6 = 0x48;
  if (lVar2 == 0) {
    if (*(long *)(sVar5 + 0x78) == 0) {
      sysbvm_error_assertionFailure
                (
                "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/bytecodeCompiler.c:1566: assertion failure: functionDefinition->sourceAnalyzedDefinition"
                );
    }
    lVar2 = *(long *)(sVar5 + 0x78);
    lVar6 = 0x20;
  }
  uVar1 = *(ulong *)(lVar2 + lVar6);
  bVar8 = (uVar1 & 0xf) != 0;
  if (bVar8 || uVar1 == 0) {
    sVar5 = 0;
  }
  else {
    sVar5 = (sysbvm_tuple_t)(*(uint *)(uVar1 + 0xc) >> 3);
  }
  captures = sysbvm_array_create(context,sVar5);
  if (sVar5 != 0) {
    sVar7 = 0;
    do {
      if (bVar8 || uVar1 == 0) {
        uVar3 = 0;
      }
      else {
        uVar3 = *(ulong *)(uVar1 + 0x10 + sVar7 * 8);
      }
      if ((uVar3 & 0xf) == 0 && uVar3 != 0) {
        sVar4 = *(sysbvm_tuple_t *)(uVar3 + 0x48);
      }
      else {
        sVar4 = 0;
      }
      sVar4 = sysbvm_functionBytecodeDirectCompiler_getBindingValue
                        (context,(sysbvm_functionBytecodeDirectCompiler_t *)arguments[1],sVar4);
      if ((captures & 0xf) == 0 && captures != 0) {
        *(sysbvm_tuple_t *)(captures + 0x10 + sVar7 * 8) = sVar4;
      }
      sVar7 = sVar7 + 1;
    } while (sVar5 != sVar7);
  }
  sVar5 = sysbvm_functionBytecodeAssembler_newTemporary
                    (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),
                     *(sysbvm_tuple_t *)(*arguments + 0x20));
  sysbvm_functionBytecodeAssembler_makeClosureWithCaptures
            (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),sVar5,
             functionDefinition,captures);
  if (*(sysbvm_tuple_t *)(*arguments + 0x68) != 0) {
    sysbvm_methodDictionary_atPut
              (context,*(sysbvm_tuple_t *)(arguments[1] + 0x18),
               *(sysbvm_tuple_t *)(*arguments + 0x68),sVar5);
  }
  return sVar5;
}

Assistant:

static sysbvm_tuple_t sysbvm_astLambdaNode_primitiveCompileIntoBytecode(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_functionBytecodeDirectCompiler_t **compiler = (sysbvm_functionBytecodeDirectCompiler_t **)&arguments[1];

    sysbvm_astLambdaNode_t **lambdaNode = (sysbvm_astLambdaNode_t**)node;

    sysbvm_functionDefinition_t *functionDefinition = (sysbvm_functionDefinition_t*)(*lambdaNode)->functionDefinition;
    sysbvm_tuple_t functionDefinitionOperand = sysbvm_functionBytecodeAssembler_addLiteral(context, (*compiler)->assembler, (sysbvm_tuple_t)functionDefinition);

    sysbvm_tuple_t captureList = SYSBVM_NULL_TUPLE;
    if(functionDefinition->bytecode)
    {
        captureList = ((sysbvm_functionBytecode_t*)functionDefinition->bytecode)->captures;
    }
    else
    {
        SYSBVM_ASSERT(functionDefinition->sourceAnalyzedDefinition);
        captureList = ((sysbvm_functionSourceAnalyzedDefinition_t*)functionDefinition->sourceAnalyzedDefinition)->captures;
    }

    size_t captureVectorSize = sysbvm_array_getSize(captureList);
    sysbvm_tuple_t captureVector = sysbvm_array_create(context, captureVectorSize);
    
    for(size_t i = 0; i < captureVectorSize; ++i)
    {
        sysbvm_tuple_t captureBinding = sysbvm_symbolCaptureBinding_getSourceBinding(sysbvm_array_at(captureList, i));
        sysbvm_tuple_t captureValue = sysbvm_functionBytecodeDirectCompiler_getBindingValue(context, *compiler, captureBinding);

        sysbvm_array_atPut(captureVector, i, captureValue);
    }

    sysbvm_tuple_t result = sysbvm_functionBytecodeAssembler_newTemporary(context, (*compiler)->assembler, (*lambdaNode)->super.analyzedType);
    sysbvm_functionBytecodeAssembler_makeClosureWithCaptures(context, (*compiler)->assembler, result, functionDefinitionOperand, captureVector);

    if((*lambdaNode)->binding)
        sysbvm_functionBytecodeDirectCompiler_setBindingValue(context, *compiler, (*lambdaNode)->binding, result);
    return result;
}